

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Node_deleteMembersAnyNodeClass(UA_Node *node)

{
  UA_NodeClass UVar1;
  
  UA_NodeId_deleteMembers(&node->nodeId);
  UA_QualifiedName_deleteMembers(&node->browseName);
  UA_LocalizedText_deleteMembers(&node->displayName);
  UA_LocalizedText_deleteMembers(&node->description);
  UA_Array_delete(node->references,node->referencesSize,UA_TYPES + 0x38);
  node->referencesSize = 0;
  node->references = (UA_ReferenceNode *)0x0;
  UVar1 = node->nodeClass;
  if (UVar1 != UA_NODECLASS_VARIABLE) {
    if (UVar1 == UA_NODECLASS_REFERENCETYPE) {
      UA_LocalizedText_deleteMembers((UA_LocalizedText *)&node[1].nodeId.identifier.string);
      return;
    }
    if (UVar1 != UA_NODECLASS_VARIABLETYPE) {
      return;
    }
  }
  UA_NodeId_deleteMembers(&node[1].nodeId);
  UA_Array_delete((void *)node[1].browseName.name.length,*(size_t *)&node[1].browseName,UA_TYPES + 5
                 );
  *(undefined8 *)&node[1].browseName = 0;
  node[1].browseName.name.length = 0;
  if (*(int *)&node[1].browseName.name.data != 0) {
    return;
  }
  UA_DataValue_deleteMembers((UA_DataValue *)&node[1].displayName);
  return;
}

Assistant:

void UA_Node_deleteMembersAnyNodeClass(UA_Node *node) {
    /* delete standard content */
    UA_NodeId_deleteMembers(&node->nodeId);
    UA_QualifiedName_deleteMembers(&node->browseName);
    UA_LocalizedText_deleteMembers(&node->displayName);
    UA_LocalizedText_deleteMembers(&node->description);
    UA_Array_delete(node->references, node->referencesSize,
                    &UA_TYPES[UA_TYPES_REFERENCENODE]);
    node->references = NULL;
    node->referencesSize = 0;

    /* delete unique content of the nodeclass */
    switch(node->nodeClass) {
    case UA_NODECLASS_OBJECT:
        break;
    case UA_NODECLASS_METHOD:
        break;
    case UA_NODECLASS_OBJECTTYPE:
        break;
    case UA_NODECLASS_VARIABLE:
    case UA_NODECLASS_VARIABLETYPE: {
        UA_VariableNode *p = (UA_VariableNode*)node;
        UA_NodeId_deleteMembers(&p->dataType);
        UA_Array_delete(p->arrayDimensions, p->arrayDimensionsSize,
                        &UA_TYPES[UA_TYPES_INT32]);
        p->arrayDimensions = NULL;
        p->arrayDimensionsSize = 0;
        if(p->valueSource == UA_VALUESOURCE_DATA)
            UA_DataValue_deleteMembers(&p->value.data.value);
        break;
    }
    case UA_NODECLASS_REFERENCETYPE: {
        UA_ReferenceTypeNode *p = (UA_ReferenceTypeNode*)node;
        UA_LocalizedText_deleteMembers(&p->inverseName);
        break;
    }
    case UA_NODECLASS_DATATYPE:
        break;
    case UA_NODECLASS_VIEW:
        break;
    default:
        break;
    }
}